

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_component.cpp
# Opt level: O3

void __thiscall lsim::SimComponent::apply_initial_values(SimComponent *this)

{
  bool bVar1;
  Value value;
  ulong uVar2;
  
  value = ModelComponent::property_value(this->m_comp_desc,"initial_output",VALUE_UNDEFINED);
  if ((value != VALUE_UNDEFINED) &&
     (uVar2 = (ulong)this->m_output_start, this->m_output_start < this->m_control_start)) {
    do {
      Simulator::pin_set_initial_value
                (this->m_sim,
                 (this->m_pins).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar2],value);
      uVar2 = uVar2 + 1;
    } while (uVar2 < this->m_control_start);
  }
  if ((this->m_comp_desc->m_type == 1) &&
     ((this->m_user_values).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->m_user_values).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    bVar1 = ModelComponent::property_value(this->m_comp_desc,"tri_state",false);
    if ((!bVar1) &&
       (uVar2 = (ulong)this->m_output_start, this->m_output_start < this->m_control_start)) {
      do {
        (this->m_user_values).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>._M_impl.
        super__Vector_impl_data._M_start[uVar2] = VALUE_FALSE;
        Simulator::pin_set_initial_value
                  (this->m_sim,
                   (this->m_pins).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar2],value);
        uVar2 = uVar2 + 1;
      } while (uVar2 < this->m_control_start);
    }
  }
  return;
}

Assistant:

void SimComponent::apply_initial_values() {
	auto initial_out = m_comp_desc->property_value("initial_output", VALUE_UNDEFINED);
	if (initial_out != VALUE_UNDEFINED) {
		for (size_t pin = m_output_start; pin < m_control_start; ++pin) {
			m_sim->pin_set_initial_value(m_pins[pin], initial_out);
		}
	}

	if (m_comp_desc->type() == COMPONENT_CONNECTOR_IN &&
		!m_user_values.empty() &&
		!m_comp_desc->property_value("tri_state", false)) {
		for (size_t pin = m_output_start; pin < m_control_start; ++pin) {
			m_user_values[pin] = VALUE_FALSE;
			m_sim->pin_set_initial_value(m_pins[pin], initial_out);
		}
	}
}